

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

void __thiscall
lzham::lzham_decompressor::lzham_decompressor
          (lzham_decompressor *this,lzham_malloc_context malloc_context)

{
  undefined8 *puVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint i;
  lzham_malloc_context in_stack_fffffffffffffe98;
  quasi_adaptive_huffman_data_model *in_stack_fffffffffffffea0;
  lzham_malloc_context in_stack_fffffffffffffec8;
  symbol_codec *in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  undefined8 in_stack_fffffffffffffee0;
  lzham_malloc_context in_stack_fffffffffffffee8;
  undefined8 *puVar2;
  quasi_adaptive_huffman_data_model *in_stack_fffffffffffffef0;
  undefined8 *local_f8;
  undefined8 *local_e0;
  undefined8 *local_c8;
  undefined8 *local_b0;
  undefined8 *local_98;
  undefined8 *local_70;
  undefined8 *local_50;
  uint local_20;
  
  *in_RDI = in_RSI;
  symbol_codec::symbol_codec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0),(uint)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0),(uint)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0),(uint)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
  local_50 = in_RDI + 99;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0),(uint)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
    local_50 = local_50 + 0x12;
  } while (local_50 != in_RDI + 0x87);
  local_70 = in_RDI + 0x87;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0),(uint)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
    local_70 = local_70 + 0x12;
  } while (local_70 != in_RDI + 0xab);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0),(uint)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
  local_98 = in_RDI + 0xbd;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x124a0f);
    local_98 = (undefined8 *)((long)local_98 + 2);
  } while (local_98 != in_RDI + 0xc0);
  local_b0 = in_RDI + 0xc0;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x124a6c);
    local_b0 = (undefined8 *)((long)local_b0 + 2);
  } while (local_b0 != in_RDI + 0xc3);
  local_c8 = in_RDI + 0xc3;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x124ac9);
    local_c8 = (undefined8 *)((long)local_c8 + 2);
  } while (local_c8 != in_RDI + 0xc6);
  local_e0 = in_RDI + 0xc6;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x124b23);
    local_e0 = (undefined8 *)((long)local_e0 + 2);
  } while (local_e0 != in_RDI + 0xc9);
  local_f8 = in_RDI + 0xc9;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x124b71);
    local_f8 = (undefined8 *)((long)local_f8 + 2);
  } while (local_f8 != in_RDI + 0xcc);
  puVar1 = in_RDI + 0xcc;
  puVar2 = in_RDI + 0xcf;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x124bb9);
    puVar1 = (undefined8 *)((long)puVar1 + 2);
  } while (puVar1 != puVar2);
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    quasi_adaptive_huffman_data_model::set_malloc_context
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    quasi_adaptive_huffman_data_model::set_malloc_context
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  return;
}

Assistant:

lzham_decompressor(lzham_malloc_context malloc_context) : 
         m_malloc_context(malloc_context),
         m_codec(malloc_context),
         m_lit_table(malloc_context),
         m_delta_lit_table(malloc_context),
         m_main_table(malloc_context),
         m_dist_lsb_table(malloc_context)
      {
         for (uint i = 0; i < 2; i++)
         {
            m_rep_len_table[i].set_malloc_context(malloc_context);
            m_large_len_table[i].set_malloc_context(malloc_context);
         }
      }